

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.hpp
# Opt level: O0

void __thiscall StrX::StrX(StrX *this,XMLCh *toTranscode)

{
  XMLCh *pXVar1;
  char *pcVar2;
  XMLCh *toTranscode_local;
  StrX *this_local;
  
  pXVar1 = xercesc_4_0::XMLString::replicate
                     (toTranscode,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  this->fUnicodeForm = pXVar1;
  pcVar2 = (char *)xercesc_4_0::XMLString::transcode
                             (toTranscode,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  this->fLocalForm = pcVar2;
  return;
}

Assistant:

StrX(const XMLCh* const toTranscode)
    {
        fUnicodeForm = XMLString::replicate(toTranscode);
        fLocalForm   = XMLString::transcode(toTranscode);
    }